

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ScopedElement * __thiscall
Catch::XmlWriter::ScopedElement::operator=(ScopedElement *this,ScopedElement *other)

{
  undefined8 *in_RSI;
  ScopedElement *in_RDI;
  XmlWriter *in_stack_00000020;
  
  if (in_RDI->m_writer != (XmlWriter *)0x0) {
    endElement(in_stack_00000020);
  }
  in_RDI->m_writer = (XmlWriter *)*in_RSI;
  *in_RSI = 0;
  return in_RDI;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::operator=( ScopedElement&& other ) noexcept {
        if ( m_writer ) {
            m_writer->endElement();
        }
        m_writer = other.m_writer;
        other.m_writer = nullptr;
        return *this;
    }